

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void __thiscall Fl_Type::insert(Fl_Type *this,Fl_Type *g)

{
  int iVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  Fl_Type **ppFVar4;
  
  pFVar3 = this;
  do {
    pFVar2 = pFVar3;
    pFVar3 = pFVar2->next;
  } while (pFVar2->next != (Fl_Type *)0x0);
  this->parent = g->parent;
  iVar1 = g->level;
  this->visible = g->visible;
  for (pFVar3 = this->next; pFVar3 != (Fl_Type *)0x0; pFVar3 = pFVar3->next) {
    pFVar3->level = pFVar3->level + (iVar1 - this->level);
  }
  this->level = iVar1;
  pFVar3 = g->prev;
  ppFVar4 = &first;
  if (pFVar3 != (Fl_Type *)0x0) {
    ppFVar4 = &pFVar3->next;
  }
  this->prev = pFVar3;
  *ppFVar4 = this;
  pFVar2->next = g;
  g->prev = pFVar2;
  fixvisible(this);
  pFVar3 = this->parent;
  if (pFVar3 != (Fl_Type *)0x0) {
    (*pFVar3->_vptr_Fl_Type[8])(pFVar3,this,g);
  }
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  return;
}

Assistant:

void Fl_Type::insert(Fl_Type *g) {
  Fl_Type *end = this;
  while (end->next) end = end->next;
  parent = g->parent;
  int newlevel = g->level;
  visible = g->visible;
  for (Fl_Type *t = this->next; t; t = t->next) t->level += newlevel-level;
  level = newlevel;
  prev = g->prev;
  if (prev) prev->next = this; else first = this;
  end->next = g;
  g->prev = end;
  fixvisible(this);
  if (parent) parent->add_child(this, g);
  widget_browser->redraw();
}